

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mode_setting.cpp
# Opt level: O0

spv_result_t spvtools::val::ValidateFloatControls2(ValidationState_t *_)

{
  __node_base_ptr this;
  bool bVar1;
  Op OVar2;
  FPFastMathModeMask FVar3;
  uint32_t func;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  size_type sVar5;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *this_00;
  reference pvVar6;
  Function *this_01;
  reference puVar7;
  size_type sVar8;
  char *__s;
  DiagnosticStream *pDVar9;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *this_02;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar10;
  pair<spvtools::val::Instruction_*,_spv::Decoration> pVar11;
  pair<std::__detail::_Node_iterator<const_spvtools::val::Instruction_*,_true,_false>,_bool> pVar12;
  pair<const_spvtools::val::Instruction_*,_spv::Decoration> pVar13;
  value_type local_410;
  reference local_400;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> *pair;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *__range4_1;
  DiagnosticStream local_3d8;
  allocator<char> local_1f9;
  undefined1 local_1f8 [8];
  string dec;
  const_iterator cStack_1d0;
  uint entry_point_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *entry_points;
  Function *function;
  Decoration local_184;
  Instruction *pIStack_180;
  Decoration decoration_1;
  Instruction *inst_1;
  unordered_set<const_spvtools::val::Instruction_*,_std::hash<const_spvtools::val::Instruction_*>,_std::equal_to<const_spvtools::val::Instruction_*>,_std::allocator<const_spvtools::val::Instruction_*>_>
  visited;
  pair<spvtools::val::Instruction_*,_spv::Decoration> local_130;
  pair<const_spvtools::val::Instruction_*,_spv::Decoration> local_120;
  FPFastMathModeMask local_10c;
  Instruction *pIStack_108;
  FPFastMathModeMask mask;
  Decoration local_100;
  pair<spvtools::val::Instruction_*,_spv::Decoration> local_f8;
  pair<const_spvtools::val::Instruction_*,_spv::Decoration> local_e8;
  Instruction *local_d8;
  Instruction *target;
  uint target_id;
  Decoration decoration;
  Instruction *inst;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *__range2_1;
  vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
  worklist;
  key_type local_7c;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
  *local_78;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
  *exec_modes;
  const_iterator cStack_68;
  uint entry_point;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  fp_fast_math_default_entry_points;
  ValidationState_t *__local;
  
  fp_fast_math_default_entry_points._M_h._M_single_bucket = (__node_base_ptr)_;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&__range2);
  pvVar4 = ValidationState_t::entry_points
                     ((ValidationState_t *)fp_fast_math_default_entry_points._M_h._M_single_bucket);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar4);
  cStack_68 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar4);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff98), bVar1) {
    puVar7 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    exec_modes._4_4_ = *puVar7;
    local_78 = ValidationState_t::GetExecutionModes
                         ((ValidationState_t *)
                          fp_fast_math_default_entry_points._M_h._M_single_bucket,exec_modes._4_4_);
    bVar1 = false;
    if (local_78 !=
        (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
         *)0x0) {
      local_7c = ExecutionModeFPFastMathDefault;
      sVar5 = std::
              set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
              ::count(local_78,&local_7c);
      bVar1 = sVar5 != 0;
    }
    if (bVar1) {
      pVar10 = std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&__range2,(value_type *)((long)&exec_modes + 4));
      worklist.
      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)pVar10.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
  ::vector((vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
            *)&__range2_1);
  this_00 = ValidationState_t::ordered_instructions
                      ((ValidationState_t *)fp_fast_math_default_entry_points._M_h._M_single_bucket)
  ;
  __end2_1 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
             begin(this_00);
  inst = (Instruction *)
         std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::end
                   (this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                             *)&inst), bVar1) {
    _target_id = __gnu_cxx::
                 __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                 ::operator*(&__end2_1);
    OVar2 = Instruction::opcode(_target_id);
    if (OVar2 == OpDecorate) {
      target._4_4_ = Instruction::GetOperandAs<spv::Decoration>(_target_id,1);
      target._0_4_ = Instruction::GetOperandAs<unsigned_int>(_target_id,0);
      local_d8 = ValidationState_t::FindDef
                           ((ValidationState_t *)
                            fp_fast_math_default_entry_points._M_h._M_single_bucket,(uint)target);
      if (target._4_4_ == DecorationNoContraction) {
        pVar11 = std::make_pair<spvtools::val::Instruction*const&,spv::Decoration_const&>
                           (&local_d8,(Decoration *)((long)&target + 4));
        pIStack_108 = pVar11.first;
        local_100 = pVar11.second;
        local_f8.first = pIStack_108;
        local_f8.second = local_100;
        std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>::
        pair<spvtools::val::Instruction_*,_spv::Decoration,_true>(&local_e8,&local_f8);
        std::
        vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
        ::push_back((vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
                     *)&__range2_1,&local_e8);
      }
      else if (target._4_4_ == DecorationFPFastMathMode) {
        local_10c = Instruction::GetOperandAs<spv::FPFastMathModeMask>(_target_id,2);
        FVar3 = spv::operator&(local_10c,Fast);
        if (FVar3 != MaskNone) {
          pVar11 = std::make_pair<spvtools::val::Instruction*const&,spv::Decoration_const&>
                             (&local_d8,(Decoration *)((long)&target + 4));
          visited._M_h._M_single_bucket = (__node_base_ptr)pVar11.first;
          local_130.second = pVar11.second;
          local_130.first = (Instruction *)visited._M_h._M_single_bucket;
          std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>::
          pair<spvtools::val::Instruction_*,_spv::Decoration,_true>(&local_120,&local_130);
          std::
          vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
          ::push_back((vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
                       *)&__range2_1,&local_120);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
    ::operator++(&__end2_1);
  }
  std::
  unordered_set<const_spvtools::val::Instruction_*,_std::hash<const_spvtools::val::Instruction_*>,_std::equal_to<const_spvtools::val::Instruction_*>,_std::allocator<const_spvtools::val::Instruction_*>_>
  ::unordered_set((unordered_set<const_spvtools::val::Instruction_*,_std::hash<const_spvtools::val::Instruction_*>,_std::equal_to<const_spvtools::val::Instruction_*>,_std::allocator<const_spvtools::val::Instruction_*>_>
                   *)&inst_1);
LAB_00bbdb1a:
  do {
    do {
      bVar1 = std::
              vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
              ::empty((vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
                       *)&__range2_1);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __local._4_4_ = SPV_SUCCESS;
LAB_00bbde3e:
        std::
        unordered_set<const_spvtools::val::Instruction_*,_std::hash<const_spvtools::val::Instruction_*>,_std::equal_to<const_spvtools::val::Instruction_*>,_std::allocator<const_spvtools::val::Instruction_*>_>
        ::~unordered_set((unordered_set<const_spvtools::val::Instruction_*,_std::hash<const_spvtools::val::Instruction_*>,_std::equal_to<const_spvtools::val::Instruction_*>,_std::allocator<const_spvtools::val::Instruction_*>_>
                          *)&inst_1);
        std::
        vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
        ::~vector((vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
                   *)&__range2_1);
        std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&__range2);
        return __local._4_4_;
      }
      pvVar6 = std::
               vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
               ::back((vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
                       *)&__range2_1);
      pIStack_180 = pvVar6->first;
      pvVar6 = std::
               vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
               ::back((vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
                       *)&__range2_1);
      local_184 = pvVar6->second;
      std::
      vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
      ::pop_back((vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
                  *)&__range2_1);
      pVar12 = std::
               unordered_set<const_spvtools::val::Instruction_*,_std::hash<const_spvtools::val::Instruction_*>,_std::equal_to<const_spvtools::val::Instruction_*>,_std::allocator<const_spvtools::val::Instruction_*>_>
               ::insert((unordered_set<const_spvtools::val::Instruction_*,_std::hash<const_spvtools::val::Instruction_*>,_std::equal_to<const_spvtools::val::Instruction_*>,_std::allocator<const_spvtools::val::Instruction_*>_>
                         *)&inst_1,&stack0xfffffffffffffe80);
    } while (((pVar12.second ^ 0xffU) & 1) != 0);
    this_01 = Instruction::function(pIStack_180);
    this = fp_fast_math_default_entry_points._M_h._M_single_bucket;
    if (this_01 != (Function *)0x0) {
      func = Function::id(this_01);
      pvVar4 = ValidationState_t::FunctionEntryPoints((ValidationState_t *)this,func);
      __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar4);
      cStack_1d0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar4);
      while (bVar1 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffe30), bVar1) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end4);
        dec.field_2._12_4_ = *puVar7;
        sVar8 = std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&__range2,(key_type *)(dec.field_2._M_local_buf + 0xc));
        if (sVar8 != 0) {
          __s = "FPFastMathMode Fast";
          if (local_184 == DecorationNoContraction) {
            __s = "NoContraction";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)local_1f8,__s,&local_1f9);
          std::allocator<char>::~allocator(&local_1f9);
          ValidationState_t::diag
                    (&local_3d8,
                     (ValidationState_t *)fp_fast_math_default_entry_points._M_h._M_single_bucket,
                     SPV_ERROR_INVALID_DATA,pIStack_180);
          pDVar9 = DiagnosticStream::operator<<
                             (&local_3d8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1f8);
          pDVar9 = DiagnosticStream::operator<<
                             (pDVar9,(char (*) [76])
                                     " cannot be used by an entry point with the FPFastMathDefault execution mode"
                             );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream(&local_3d8);
          std::__cxx11::string::~string((string *)local_1f8);
          goto LAB_00bbde3e;
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end4);
      }
      goto LAB_00bbdb1a;
    }
    this_02 = Instruction::uses(pIStack_180);
    __end4_1 = std::
               vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
               ::begin(this_02);
    pair = (pair<const_spvtools::val::Instruction_*,_unsigned_int> *)
           std::
           vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
           ::end(this_02);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4_1,
                              (__normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                               *)&pair), bVar1) {
      local_400 = __gnu_cxx::
                  __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                  ::operator*(&__end4_1);
      pVar13 = std::make_pair<spvtools::val::Instruction_const*const&,spv::Decoration_const&>
                         (&local_400->first,&local_184);
      local_410.first = pVar13.first;
      local_410.second = pVar13.second;
      std::
      vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
      ::push_back((vector<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_spv::Decoration>_>_>
                   *)&__range2_1,&local_410);
      __gnu_cxx::
      __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
      ::operator++(&__end4_1);
    }
  } while( true );
}

Assistant:

spv_result_t ValidateFloatControls2(ValidationState_t& _) {
  std::unordered_set<uint32_t> fp_fast_math_default_entry_points;
  for (auto entry_point : _.entry_points()) {
    const auto* exec_modes = _.GetExecutionModes(entry_point);
    if (exec_modes &&
        exec_modes->count(spv::ExecutionMode::FPFastMathDefault)) {
      fp_fast_math_default_entry_points.insert(entry_point);
    }
  }

  std::vector<std::pair<const Instruction*, spv::Decoration>> worklist;
  for (const auto& inst : _.ordered_instructions()) {
    if (inst.opcode() != spv::Op::OpDecorate) {
      continue;
    }

    const auto decoration = inst.GetOperandAs<spv::Decoration>(1);
    const auto target_id = inst.GetOperandAs<uint32_t>(0);
    const auto target = _.FindDef(target_id);
    if (decoration == spv::Decoration::NoContraction) {
      worklist.push_back(std::make_pair(target, decoration));
    } else if (decoration == spv::Decoration::FPFastMathMode) {
      auto mask = inst.GetOperandAs<spv::FPFastMathModeMask>(2);
      if ((mask & spv::FPFastMathModeMask::Fast) !=
          spv::FPFastMathModeMask::MaskNone) {
        worklist.push_back(std::make_pair(target, decoration));
      }
    }
  }

  std::unordered_set<const Instruction*> visited;
  while (!worklist.empty()) {
    const auto inst = worklist.back().first;
    const auto decoration = worklist.back().second;
    worklist.pop_back();

    if (!visited.insert(inst).second) {
      continue;
    }

    const auto function = inst->function();
    if (function) {
      const auto& entry_points = _.FunctionEntryPoints(function->id());
      for (auto entry_point : entry_points) {
        if (fp_fast_math_default_entry_points.count(entry_point)) {
          const std::string dec = decoration == spv::Decoration::NoContraction
                                      ? "NoContraction"
                                      : "FPFastMathMode Fast";
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << dec
                 << " cannot be used by an entry point with the "
                    "FPFastMathDefault execution mode";
        }
      }
    } else {
      for (const auto& pair : inst->uses()) {
        worklist.push_back(std::make_pair(pair.first, decoration));
      }
    }
  }

  return SPV_SUCCESS;
}